

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpsm_cli_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  MatchInfo *pMVar1;
  string_ref query_00;
  pointer __first;
  pointer pTVar2;
  pointer __last;
  pointer pMVar3;
  bool bVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  char *pcVar6;
  typed_value<unsigned_long,_char> *ptVar7;
  size_type sVar8;
  ostream *poVar9;
  istream *piVar10;
  any *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  unsigned_long *puVar13;
  size_type __n;
  pointer __result;
  Thread *pTVar14;
  Error *pEVar15;
  code *info;
  MatcherOptions *opts_00;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_00;
  anon_class_48_6_59189e45_for__M_head_impl *__args;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_01;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_02;
  anon_class_48_6_59189e45_for__M_head_impl *__args_00;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *matches;
  size_type __n_00;
  pointer pMVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  StringRefItem item;
  StringRefItem item_00;
  vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> threads;
  _Alloc_hider local_390;
  size_type local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined2 local_370;
  char local_36e;
  undefined4 local_36d;
  undefined1 local_369;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  all_matches;
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  thread_matches;
  char *local_330;
  size_t sStack_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  MatcherOptions local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> crfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  undefined1 local_2b0 [32];
  Iterator local_290;
  thread local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  pointer local_188;
  pointer pbStack_180;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_178;
  variables_map opts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_140 [144];
  options_description opts_desc;
  
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  std::__cxx11::string::string((string *)local_2b0,"Options",(allocator *)&opts);
  boost::program_options::options_description::options_description
            (&opts_desc,(string *)local_2b0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)local_2b0);
  local_390._M_p = (pointer)boost::program_options::options_description::add_options();
  ptVar5 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)local_2b0,"",(allocator *)&crfile);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2b0);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&stack0xfffffffffffffc70,(value_semantic *)"crfile",
                              (char *)ptVar5);
  ptVar7 = boost::program_options::value<unsigned_long>();
  local_320._M_dataplus._M_p = (pointer)0xa;
  ptVar7 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar7,(unsigned_long *)&local_320);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"limit",(char *)ptVar7);
  ptVar5 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string((string *)&opts,"",(allocator *)&query);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&opts);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"query",(char *)ptVar5);
  boost::program_options::options_description_easy_init::operator()(pcVar6,"help");
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)local_2b0);
  boost::program_options::variables_map::variables_map(&opts);
  local_178.super_function_base.vtable = (vtable_base *)0x0;
  local_178.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_178.super_function_base.functor._8_8_ = 0;
  local_178.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_2b0,argc,argv,&opts_desc,0,&local_178);
  boost::program_options::store((basic_parsed_options *)local_2b0,&opts,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_2b0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_178);
  boost::program_options::notify(&opts);
  std::__cxx11::string::string((string *)local_2b0,"help",(allocator *)&stack0xfffffffffffffc70);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_140,(key_type *)local_2b0);
  std::__cxx11::string::~string((string *)local_2b0);
  if (sVar8 == 0) {
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      local_320._M_string_length = 0;
      *local_320._M_dataplus._M_p = '\0';
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&std::cin,(string *)&local_320);
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&lines,
                 &local_320);
    }
    std::__cxx11::string::string((string *)local_2b0,"crfile",(allocator *)&stack0xfffffffffffffc70)
    ;
    paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&opts);
    pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
    std::__cxx11::string::string((string *)&crfile,(string *)pbVar12);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::string((string *)local_2b0,"limit",(allocator *)&stack0xfffffffffffffc70);
    paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&opts);
    puVar13 = boost::any_cast<unsigned_long_const&>(paVar11);
    pMVar1 = (MatchInfo *)*puVar13;
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::string((string *)local_2b0,"query",(allocator *)&stack0xfffffffffffffc70);
    paVar11 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&opts);
    pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar11);
    std::__cxx11::string::string((string *)&query,(string *)pbVar12);
    std::__cxx11::string::~string((string *)local_2b0);
    local_369 = 0;
    local_36d = 0;
    local_390._M_p = crfile._M_dataplus._M_p;
    local_388 = crfile._M_string_length;
    local_378 = 0x100000000;
    local_370 = 1;
    local_36e = '\x01';
    local_188 = lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pbStack_180 = lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_330 = query._M_dataplus._M_p;
    sStack_328 = query._M_string_length;
    local_300.crfile.ptr_ = crfile._M_dataplus._M_p;
    local_300.crfile.len_ = crfile._M_string_length;
    local_300.match_crfile = false;
    local_380 = pMVar1;
    std::
    vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
    ::vector(&thread_matches,1,(allocator_type *)local_2b0);
    threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::reserve
              (&threads,(ulong)local_378 >> 0x20);
    uVar18 = 0;
    __args_00 = extraout_RDX;
    while( true ) {
      pTVar2 = threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((uint)local_378._4_4_ <= uVar18) break;
      local_2b0._16_8_ = &local_188;
      local_2b0._24_8_ = &local_330;
      local_290._M_current = (char *)&local_300;
      local_288._M_id._M_thread = (id)&thread_matches;
      local_2b0._0_4_ = uVar18;
      local_2b0._8_8_ = (pointer)&stack0xfffffffffffffc70;
      if (threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        __n = std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
        __last = threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        __first = threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __result = std::_Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>::_M_allocate
                             (&threads.
                               super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>,__n);
        std::allocator_traits<std::allocator<cpsm::Thread>>::
        construct<cpsm::Thread,cpsm::detail::for_each_match<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>(boost::basic_string_ref<char,std::char_traits<char>>,cpsm::Options_const&,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&&,main::__0&&)::_lambda()_1_>
                  ((allocator_type *)(((long)pTVar2 - (long)__first) + (long)__result),
                   (Thread *)local_2b0,__args);
        pTVar14 = std::__relocate_a_1<cpsm::Thread*,cpsm::Thread*,std::allocator<cpsm::Thread>>
                            (__first,pTVar2,__result,(allocator<cpsm::Thread> *)&threads);
        pTVar14 = std::__relocate_a_1<cpsm::Thread*,cpsm::Thread*,std::allocator<cpsm::Thread>>
                            (pTVar2,__last,pTVar14 + 1,(allocator<cpsm::Thread> *)&threads);
        __args_00 = extraout_RDX_01;
        if (__first != (pointer)0x0) {
          operator_delete(__first);
          __args_00 = extraout_RDX_02;
        }
        threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __result + __n;
        threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
        super__Vector_impl_data._M_start = __result;
        threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
        super__Vector_impl_data._M_finish = pTVar14;
      }
      else {
        std::allocator_traits<std::allocator<cpsm::Thread>>::
        construct<cpsm::Thread,cpsm::detail::for_each_match<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>(boost::basic_string_ref<char,std::char_traits<char>>,cpsm::Options_const&,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&&,main::__0&&)::_lambda()_1_>
                  ((allocator_type *)
                   threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Thread *)local_2b0,__args_00);
        __args_00 = extraout_RDX_00;
        threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar18 = uVar18 + 1;
    }
    lVar20 = 8;
    lVar17 = 0x28;
    __n_00 = 0;
    for (uVar19 = 0;
        pTVar2 = threads.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar19 < (uint)local_378._4_4_;
        uVar19 = uVar19 + 1) {
      std::thread::join();
      if (*(char *)((long)pTVar2 + lVar17 + -8) == '\x01') {
        pEVar15 = (Error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)local_2b0,(string *)((long)pTVar2 + lVar17 + -0x28));
        cpsm::Error::Error<std::__cxx11::string>
                  (pEVar15,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b0);
        __cxa_throw(pEVar15,&cpsm::Error::typeinfo,cpsm::Error::~Error);
      }
      __n_00 = __n_00 + (*(long *)((long)&((thread_matches.
                                            super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar20) -
                        *(long *)((long)thread_matches.
                                        super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8)) /
                        0x18;
      lVar20 = lVar20 + 0x18;
      lVar17 = lVar17 + 0x30;
    }
    all_matches.
    super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_matches.
    super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_matches.
    super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::reserve(&all_matches,__n_00);
    for (; thread_matches.
           super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           thread_matches.
           super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        thread_matches.
        super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             thread_matches.
             super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<cpsm::detail::Matched<cpsm::StringRefItem>*,std::back_insert_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>>
                (((thread_matches.
                   super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 ((thread_matches.
                   super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,&all_matches);
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::_M_shrink_to_fit(thread_matches.
                         super__Vector_base<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    if (((MatchInfo *)local_380 == (MatchInfo *)0x0) ||
       ((MatchInfo *)
        (((long)all_matches.
                super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)all_matches.
               super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)local_380)) {
      info = (code *)local_380;
      std::
      __sort<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                  )all_matches.
                   super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                  )all_matches.
                   super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                  )0x11b30c);
    }
    else {
      info = cpsm::detail::Matched<cpsm::StringRefItem>::is_better;
      std::
      __partial_sort<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                ((__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                  )all_matches.
                   super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 all_matches.
                 super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_380,
                 (__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
                  )all_matches.
                   super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                  )0x11b30c);
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::resize(&all_matches,local_380);
    }
    pMVar3 = all_matches.
             super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar16 = all_matches.
              super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_36e == '\x01') {
      query_00.len_ = sStack_328;
      query_00.ptr_ = local_330;
      opts_00 = &local_300;
      cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::Matcher
                ((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)local_2b0,query_00,
                 opts_00);
      pMVar3 = all_matches.
               super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pMVar16 = all_matches.
                     super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pMVar16 != pMVar3;
          pMVar16 = pMVar16 + 1) {
        bVar4 = cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::match
                          ((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)local_2b0,
                           (pMVar16->item).item_);
        if (!bVar4) {
          pEVar15 = (Error *)__cxa_allocate_exception(0x28);
          cpsm::Error::
          Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
                    (pEVar15,"failed to re-match known match \'",(pMVar16->item).item_,
                     "\' during match position collection");
          __cxa_throw(pEVar15,&cpsm::Error::typeinfo,cpsm::Error::~Error);
        }
        item.item_.len_ = (size_t)local_2b0;
        item.item_.ptr_ = (char *)(pMVar16->item).item_.len_;
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(pMVar16->item).item_.ptr_,item,(MatchInfo *)opts_00);
      }
      cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::~Matcher
                ((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)local_2b0);
    }
    else {
      for (; pMVar16 != pMVar3; pMVar16 = pMVar16 + 1) {
        item_00.item_.len_ = 0;
        item_00.item_.ptr_ = (char *)(pMVar16->item).item_.len_;
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(pMVar16->item).item_.ptr_,item_00,(MatchInfo *)info);
      }
    }
    std::
    _Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::~_Vector_base(&all_matches.
                     super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                   );
    std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::~vector(&threads);
    std::
    vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
    ::~vector(&thread_matches);
    std::__cxx11::string::~string((string *)&query);
    std::__cxx11::string::~string((string *)&crfile);
    std::__cxx11::string::~string((string *)&local_320);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lines);
  }
  else {
    poVar9 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&opts_desc);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  boost::program_options::variables_map::~variables_map(&opts);
  boost::program_options::options_description::~options_description(&opts_desc);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::cin.sync_with_stdio(false);
  std::cout.sync_with_stdio(false);
  std::cerr.sync_with_stdio(false);

  po::options_description opts_desc("Options");
  opts_desc.add_options()
      ("crfile", po::value<std::string>()->default_value(""),
       "'currently open file' passed to the matcher")
      ("limit", po::value<std::size_t>()->default_value(10),
       "maximum number of matches to return")
      ("query", po::value<std::string>()->default_value(""),
       "query to match items against")
      ("help", "display this help and exit")
      ;

  po::variables_map opts;
  po::store(po::parse_command_line(argc, argv, opts_desc), opts);
  po::notify(opts);

  if (opts.count("help")) {
    std::cout << opts_desc << std::endl;
    return 0;
  }

  std::vector<std::string> lines;
  std::string line;
  while (std::getline(std::cin, line)) {
    lines.emplace_back(std::move(line));
    line.clear();
  }

  auto const crfile = opts["crfile"].as<std::string>();
  auto const limit = opts["limit"].as<std::size_t>();
  auto const query = opts["query"].as<std::string>();
  auto const mopts =
      cpsm::Options().set_crfile(crfile).set_limit(limit).set_want_match_info(
          true);
  cpsm::for_each_match<cpsm::StringRefItem>(
      query, mopts, cpsm::source_from_range<cpsm::StringRefItem>(lines.cbegin(),
                                                                 lines.cend()),
      [&](cpsm::StringRefItem item, cpsm::MatchInfo const* info) {
        std::cout << item.item() << "\n- score: " << info->score() << "; "
                  << info->score_debug_string() << "\n- match positions: "
                  << cpsm::str_join(info->match_positions(), ", ") << std::endl;
      });

  return 0;
}